

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void tcg_commit(MemoryListener *listener)

{
  AddressSpaceDispatch *pAVar1;
  MemoryListener *__mptr;
  AddressSpaceDispatch *d;
  CPUAddressSpace *cpuas;
  MemoryListener *listener_local;
  
  cpu_reloading_memory_map_tricore();
  pAVar1 = address_space_to_dispatch((AddressSpace *)listener[-1].link_as.tqe_next);
  listener[-1].link_as.tqe_circ.tql_prev = (QTailQLink *)pAVar1;
  tlb_flush_tricore((CPUState *)listener[-1].link.tqe_circ.tql_prev);
  return;
}

Assistant:

static void tcg_commit(MemoryListener *listener)
{
    CPUAddressSpace *cpuas;
    AddressSpaceDispatch *d;

    /* since each CPU stores ram addresses in its TLB cache, we must
       reset the modified entries */
    cpuas = container_of(listener, CPUAddressSpace, tcg_as_listener);
    cpu_reloading_memory_map();
    /* The CPU and TLB are protected by the iothread lock.
     * We reload the dispatch pointer now because cpu_reloading_memory_map()
     * may have split the RCU critical section.
     */
    d = address_space_to_dispatch(cpuas->as);
    cpuas->memory_dispatch = d;
    tlb_flush(cpuas->cpu);
}